

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O1

ctmbstr tidyOptGetNextDeclTag(TidyDoc tdoc,TidyOptionId optId,TidyIterator *iter)

{
  bool bVar1;
  ctmbstr ptVar2;
  TidyIterator p_Var3;
  undefined4 uVar4;
  TidyDocImpl *impl;
  
  if (tdoc == (TidyDoc)0x0) {
    return (ctmbstr)0x0;
  }
  if ((int)optId < 0x27) {
    if (optId == TidyBlockTags) {
      uVar4 = 4;
    }
    else {
      if (optId != TidyEmptyTags) {
LAB_0015922a:
        uVar4 = 0;
        bVar1 = true;
        goto LAB_0015923e;
      }
      uVar4 = 1;
    }
  }
  else if (optId == TidyInlineTags) {
    uVar4 = 2;
  }
  else {
    if (optId != TidyPreTags) goto LAB_0015922a;
    uVar4 = 8;
  }
  bVar1 = false;
LAB_0015923e:
  if (bVar1) {
    return (ctmbstr)0x0;
  }
  p_Var3 = *iter;
  if (p_Var3 == (TidyIterator)0x0) {
    ptVar2 = (ctmbstr)0x0;
    p_Var3 = (TidyIterator)0x0;
  }
  else {
    do {
      ptVar2 = (ctmbstr)0x0;
      switch(uVar4) {
      case 1:
        if ((p_Var3[8]._opaque & 1) != 0) break;
LAB_00146269:
        ptVar2 = (ctmbstr)0x0;
        goto switchD_0014623c_caseD_3;
      case 2:
        if ((p_Var3[8]._opaque & 0x10) == 0) goto LAB_00146269;
        break;
      default:
        goto switchD_0014623c_caseD_3;
      case 4:
        if (((p_Var3[8]._opaque & 8) == 0) || (*(code **)(p_Var3 + 10) != prvTidyParseBlock))
        goto LAB_00146269;
        break;
      case 8:
        if (((p_Var3[8]._opaque & 8) == 0) || (*(code **)(p_Var3 + 10) != prvTidyParsePre))
        goto LAB_00146269;
      }
      ptVar2 = *(ctmbstr *)(p_Var3 + 2);
switchD_0014623c_caseD_3:
      p_Var3 = *(TidyIterator *)(p_Var3 + 0xe);
    } while ((ptVar2 == (ctmbstr)0x0) && (p_Var3 != (TidyIterator)0x0));
  }
  *iter = p_Var3;
  return ptVar2;
}

Assistant:

ctmbstr TIDY_CALL       tidyOptGetNextDeclTag( TidyDoc tdoc, TidyOptionId optId,
                                     TidyIterator* iter )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    ctmbstr tagnam = NULL;
    if ( impl )
    {
        UserTagType tagtyp = tagtype_null;
        if ( optId == TidyInlineTags )
            tagtyp = tagtype_inline;
        else if ( optId == TidyBlockTags )
            tagtyp = tagtype_block;
        else if ( optId == TidyEmptyTags )
            tagtyp = tagtype_empty;
        else if ( optId == TidyPreTags )
            tagtyp = tagtype_pre;
        if ( tagtyp != tagtype_null )
            tagnam = TY_(GetNextDeclaredTag)( impl, tagtyp, iter );
    }
    return tagnam;
}